

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O2

void satoko_reset(satoko_t *s)

{
  uint uVar1;
  cdb *pcVar2;
  vec_wl_t *pvVar3;
  heap_t *phVar4;
  b_queue_t *pbVar5;
  ulong uVar6;
  long lVar7;
  
  s->assumptions->size = 0;
  s->final_conflict->size = 0;
  pcVar2 = s->all_clauses;
  pcVar2->wasted = 0;
  pcVar2->size = 0;
  s->originals->size = 0;
  s->learnts->size = 0;
  pvVar3 = s->watches;
  uVar1 = pvVar3->size;
  for (lVar7 = 0; (ulong)uVar1 * 0x18 - lVar7 != 0; lVar7 = lVar7 + 0x18) {
    *(undefined8 *)((long)&pvVar3->watch_lists->size + lVar7) = 0;
  }
  pvVar3->size = 0;
  s->activity->size = 0;
  phVar4 = s->var_order;
  phVar4->indices->size = 0;
  phVar4->data->size = 0;
  s->levels->size = 0;
  s->reasons->size = 0;
  s->assigns->size = 0;
  s->polarity->size = 0;
  s->trail->size = 0;
  s->trail_lim->size = 0;
  pbVar5 = s->bq_lbd;
  pbVar5->size = 0;
  pbVar5->i_first = 0;
  pbVar5->i_empty = 0;
  pbVar5->sum = 0;
  pbVar5 = s->bq_trail;
  pbVar5->size = 0;
  pbVar5->i_first = 0;
  pbVar5->i_empty = 0;
  pbVar5->sum = 0;
  s->temp_lits->size = 0;
  s->seen->size = 0;
  s->tagged->size = 0;
  s->stack->size = 0;
  s->last_dlevel->size = 0;
  s->stamps->size = 0;
  s->status = 1;
  s->var_act_inc = 0x800000000000;
  s->clause_act_inc = 0x800;
  uVar6 = (ulong)(s->opts).n_conf_fst_reduce;
  s->n_confl_bfr_reduce = uVar6;
  s->RC1 = 1;
  s->RC2 = uVar6;
  s->i_qhead = 0;
  s->book_cl_orig = 0;
  s->book_cl_lrnt = 0;
  s->book_cdb = 0;
  s->book_vars = 0;
  s->book_trail = 0;
  return;
}

Assistant:

void satoko_reset(satoko_t *s)
{
    // printf("[Satoko] Reset.\n");
    vec_uint_clear(s->assumptions);
    vec_uint_clear(s->final_conflict);
    cdb_clear(s->all_clauses);
    vec_uint_clear(s->originals);
    vec_uint_clear(s->learnts);
    vec_wl_clean(s->watches);
    vec_act_clear(s->activity);
    heap_clear(s->var_order);
    vec_uint_clear(s->levels);
    vec_uint_clear(s->reasons);
    vec_char_clear(s->assigns);
    vec_char_clear(s->polarity);
    vec_uint_clear(s->trail);
    vec_uint_clear(s->trail_lim);
    b_queue_clean(s->bq_lbd);
    b_queue_clean(s->bq_trail);
    vec_uint_clear(s->temp_lits);
    vec_char_clear(s->seen);
    vec_uint_clear(s->tagged);
    vec_uint_clear(s->stack);
    vec_uint_clear(s->last_dlevel);
    vec_uint_clear(s->stamps);
    s->status = SATOKO_OK;
    s->var_act_inc = VAR_ACT_INIT_INC;
    s->clause_act_inc = CLAUSE_ACT_INIT_INC;
    s->n_confl_bfr_reduce = s->opts.n_conf_fst_reduce;
    s->RC1 = 1;
    s->RC2 = s->opts.n_conf_fst_reduce;
    s->book_cl_orig = 0;
    s->book_cl_lrnt = 0;
    s->book_cdb = 0;
    s->book_vars = 0;
    s->book_trail = 0;
    s->i_qhead = 0;
}